

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiNavLayer IVar3;
  ImGuiScrollFlags IVar4;
  ImGuiDir IVar5;
  uint uVar6;
  int iVar7;
  ImGuiContextHook *pIVar8;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var9;
  ImGuiViewportP *pIVar10;
  ImGuiWindow **ppIVar11;
  unsigned_short *puVar12;
  bool bVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  ImGuiID key;
  int iVar18;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar19;
  ImGuiWindow **ppIVar20;
  unsigned_short *__dest;
  char *pcVar21;
  ImGuiContext *g;
  ImGuiContext *g_6;
  ImGuiDir IVar22;
  char *__s1;
  uint uVar23;
  ImGuiContext *g_1;
  ulong uVar24;
  byte bVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  ImVec2 IVar31;
  ImVec2 IVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  ImVec2 local_38;
  
  pIVar15 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  iVar18 = (GImGui->Hooks).Size;
  local_38 = in_RAX;
  if (0 < iVar18) {
    lVar26 = 0;
    lVar27 = 0;
    do {
      pIVar8 = (pIVar15->Hooks).Data;
      if (*(int *)(pIVar8 + lVar26 + 4) == 2) {
        (**(code **)(pIVar8 + lVar26 + 0x10))();
        iVar18 = (pIVar15->Hooks).Size;
      }
      lVar27 = lVar27 + 1;
      lVar26 = lVar26 + 0x20;
    } while (lVar27 < iVar18);
  }
  pIVar14 = GImGui;
  iVar18 = (GImGui->CurrentWindowStack).Size;
  while (1 < iVar18) {
    End();
    iVar18 = (pIVar14->CurrentWindowStack).Size;
  }
  p_Var9 = (pIVar15->IO).SetPlatformImeDataFn;
  if ((p_Var9 != (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
     (auVar34[0] = -((pIVar15->PlatformImeDataPrev).WantVisible ==
                    (pIVar15->PlatformImeData).WantVisible),
     auVar34[1] = -((pIVar15->PlatformImeDataPrev).field_0x1 == (pIVar15->PlatformImeData).field_0x1
                   ),
     auVar34[2] = -((pIVar15->PlatformImeDataPrev).field_0x2 == (pIVar15->PlatformImeData).field_0x2
                   ),
     auVar34[3] = -((pIVar15->PlatformImeDataPrev).field_0x3 == (pIVar15->PlatformImeData).field_0x3
                   ),
     auVar34[4] = -(*(char *)&(pIVar15->PlatformImeDataPrev).InputPos.x ==
                   *(char *)&(pIVar15->PlatformImeData).InputPos.x),
     auVar34[5] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputPos.x + 1) ==
                   *(char *)((long)&(pIVar15->PlatformImeData).InputPos.x + 1)),
     auVar34[6] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputPos.x + 2) ==
                   *(char *)((long)&(pIVar15->PlatformImeData).InputPos.x + 2)),
     auVar34[7] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputPos.x + 3) ==
                   *(char *)((long)&(pIVar15->PlatformImeData).InputPos.x + 3)),
     auVar34[8] = -(*(char *)&(pIVar15->PlatformImeDataPrev).InputPos.y ==
                   *(char *)&(pIVar15->PlatformImeData).InputPos.y),
     auVar34[9] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputPos.y + 1) ==
                   *(char *)((long)&(pIVar15->PlatformImeData).InputPos.y + 1)),
     auVar34[10] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputPos.y + 2) ==
                    *(char *)((long)&(pIVar15->PlatformImeData).InputPos.y + 2)),
     auVar34[0xb] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputPos.y + 3) ==
                     *(char *)((long)&(pIVar15->PlatformImeData).InputPos.y + 3)),
     auVar34[0xc] = -(*(char *)&(pIVar15->PlatformImeDataPrev).InputLineHeight ==
                     *(char *)&(pIVar15->PlatformImeData).InputLineHeight),
     auVar34[0xd] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputLineHeight + 1) ==
                     *(char *)((long)&(pIVar15->PlatformImeData).InputLineHeight + 1)),
     auVar34[0xe] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputLineHeight + 2) ==
                     *(char *)((long)&(pIVar15->PlatformImeData).InputLineHeight + 2)),
     auVar34[0xf] = -(*(char *)((long)&(pIVar15->PlatformImeDataPrev).InputLineHeight + 3) ==
                     *(char *)((long)&(pIVar15->PlatformImeData).InputLineHeight + 3)),
     (ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf)
     != 0xffff)) {
    (*p_Var9)(&(*(GImGui->Viewports).Data)->super_ImGuiViewport,&pIVar15->PlatformImeData);
  }
  pIVar15->WithinFrameScopeWithImplicitWindow = false;
  pIVar19 = pIVar15->CurrentWindow;
  if ((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->WriteAccessed == false)) {
    pIVar19->Active = false;
  }
  End();
  pIVar14 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar19 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar14->WindowsById,key);
      pIVar14->NavWindowingListWindow = pIVar19;
    }
    pIVar10 = *(pIVar14->Viewports).Data;
    uVar23 = (pIVar14->NextWindowData).Flags;
    IVar2 = (pIVar10->super_ImGuiViewport).Size;
    IVar31.x = IVar2.x * 0.2;
    IVar31.y = IVar2.y * 0.2;
    (pIVar14->NextWindowData).Flags = uVar23 | 0x10;
    (pIVar14->NextWindowData).SizeConstraintRect.Min = IVar31;
    (pIVar14->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar14->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar14->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar14->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar2 = (pIVar10->super_ImGuiViewport).Size;
    IVar31 = (pIVar10->super_ImGuiViewport).Pos;
    IVar32.x = IVar2.x * 0.5 + IVar31.x;
    IVar32.y = IVar2.y * 0.5 + IVar31.y;
    (pIVar14->NextWindowData).Flags = uVar23 | 0x11;
    (pIVar14->NextWindowData).PosVal = IVar32;
    (pIVar14->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar14->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar14->NextWindowData).PosCond = 1;
    IVar2 = (pIVar14->Style).WindowPadding;
    fVar29 = IVar2.x;
    fVar30 = IVar2.y;
    local_38.x = fVar29 + fVar29;
    local_38.y = fVar30 + fVar30;
    PushStyleVar(2,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar26 = (long)(pIVar14->WindowsFocusOrder).Size;
    if (0 < lVar26) {
      do {
        pIVar19 = (pIVar14->WindowsFocusOrder).Data[lVar26 + -1];
        if (((pIVar19->WasActive == true) && (pIVar19->RootWindow == pIVar19)) &&
           (uVar23 = pIVar19->Flags, (uVar23 >> 0x13 & 1) == 0)) {
          __s1 = pIVar19->Name;
          pcVar21 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_001ecb84:
            lVar27 = 0x5bd8;
            if ((uVar23 >> 0x1a & 1) == 0) {
              if (((uVar23 >> 10 & 1) == 0) || (iVar18 = strcmp(__s1,"##MainMenuBar"), iVar18 != 0))
              {
                lVar27 = 0x5be0;
              }
              else {
                lVar27 = 0x5bd0;
              }
            }
            __s1 = *(char **)(&GImGui->Initialized + lVar27);
            if (__s1 == (char *)0x0) {
              __s1 = "*Missing Text*";
            }
          }
          else {
            do {
              if (*pcVar21 == '#') {
                if (pcVar21[1] == '#') goto LAB_001ecb7f;
              }
              else if (*pcVar21 == '\0') goto LAB_001ecb7f;
              pcVar21 = pcVar21 + 1;
            } while (pcVar21 != (char *)0xffffffffffffffff);
            pcVar21 = (char *)0xffffffffffffffff;
LAB_001ecb7f:
            if (__s1 == pcVar21) goto LAB_001ecb84;
          }
          local_38.x = 0.0;
          local_38.y = 0.0;
          Selectable(__s1,pIVar14->NavWindowingTarget == pIVar19,0,&local_38);
        }
        bVar13 = 1 < lVar26;
        lVar26 = lVar26 + -1;
      } while (bVar13);
    }
    End();
    PopStyleVar(1);
  }
  pIVar16 = GImGui;
  if (((pIVar14->NavWindow != (ImGuiWindow *)0x0) && (GImGui->NavMoveScoringItems == true)) &&
     (((GImGui->NavMoveResultLocal).ID == 0 &&
      (((GImGui->NavMoveResultOther).ID == 0 &&
       (-1 < (char)pIVar14->NavMoveFlags && (pIVar14->NavMoveFlags & 0xfU) != 0)))))) {
    pIVar19 = GImGui->NavWindow;
    IVar3 = GImGui->NavLayer;
    fVar30 = pIVar19->NavRectRel[IVar3].Min.y;
    fVar29 = pIVar19->NavRectRel[IVar3].Max.y;
    iVar18 = GImGui->NavMoveDir;
    uVar23 = GImGui->NavMoveFlags;
    if (iVar18 == 0) {
      if ((uVar23 & 5) == 0) goto LAB_001ece11;
      fVar35 = (pIVar19->ContentSize).x + (pIVar19->WindowPadding).x;
      IVar22 = 0;
      fVar33 = fVar35;
      if ((uVar23 & 4) != 0) {
        fVar36 = fVar29 - fVar30;
        fVar29 = fVar29 - fVar36;
        IVar22 = 2;
        fVar30 = fVar30 - fVar36;
      }
    }
    else if ((uVar23 & 5) == 0 || iVar18 != 1) {
      fVar33 = pIVar19->NavRectRel[IVar3].Min.x;
      fVar35 = pIVar19->NavRectRel[IVar3].Max.x;
      if ((uVar23 & 10) == 0 || iVar18 != 2) {
        if (iVar18 != 3 || (uVar23 & 10) == 0) goto LAB_001ece11;
        fVar29 = -(pIVar19->WindowPadding).y;
        IVar22 = 3;
        fVar30 = fVar29;
        if ((uVar23 & 8) != 0) {
          fVar36 = fVar35 - fVar33;
          fVar33 = fVar33 + fVar36;
          fVar35 = fVar35 + fVar36;
          IVar22 = 1;
        }
      }
      else {
        fVar29 = (pIVar19->ContentSize).y + (pIVar19->WindowPadding).y;
        IVar22 = 2;
        fVar30 = fVar29;
        if ((uVar23 & 8) != 0) {
          fVar36 = fVar35 - fVar33;
          fVar33 = fVar33 - fVar36;
          fVar35 = fVar35 - fVar36;
          IVar22 = 0;
        }
      }
    }
    else {
      fVar35 = -(pIVar19->WindowPadding).x;
      IVar22 = 1;
      fVar33 = fVar35;
      if ((uVar23 & 4) != 0) {
        fVar36 = fVar29 - fVar30;
        fVar29 = fVar29 + fVar36;
        IVar22 = 3;
        fVar30 = fVar30 + fVar36;
      }
    }
    pIVar19->NavRectRel[IVar3].Min.x = fVar33;
    pIVar19->NavRectRel[IVar3].Min.y = fVar30;
    pIVar19->NavRectRel[IVar3].Max.x = fVar35;
    pIVar19->NavRectRel[IVar3].Max.y = fVar29;
    pIVar14 = GImGui;
    IVar4 = pIVar16->NavMoveScrollFlags;
    IVar5 = pIVar16->NavMoveDir;
    pIVar14->NavMoveScoringItems = false;
    pIVar14->NavMoveForwardToNextFrame = true;
    pIVar14->NavMoveSubmitted = false;
    pIVar14->NavAnyRequest = pIVar14->NavInitRequest;
    pIVar14->NavMoveDir = IVar5;
    pIVar14->NavMoveClipDir = IVar22;
    pIVar14->NavMoveFlags = uVar23 | 0x80;
    pIVar14->NavMoveScrollFlags = IVar4;
  }
LAB_001ece11:
  bVar25 = pIVar15->DragDropActive;
  iVar18 = pIVar15->FrameCount;
  if ((bool)bVar25 != true) goto LAB_001ece86;
  bVar13 = (pIVar15->DragDropPayload).Delivery;
  if ((pIVar15->DragDropPayload).DataFrameCount + 1 < iVar18) {
    if (((pIVar15->DragDropSourceFlags & 0x20) == 0) &&
       ((GImGui->IO).MouseDown[pIVar15->DragDropMouseButton] == true)) {
      bVar17 = TestKeyOwner(pIVar15->DragDropMouseButton + ImGuiKey_MouseLeft,0);
      bVar17 = !bVar17;
      goto LAB_001ece6b;
    }
  }
  else {
    bVar17 = false;
LAB_001ece6b:
    if ((!bVar17) && (bVar13 == false)) goto LAB_001ece86;
  }
  ClearDragDrop();
  bVar25 = pIVar15->DragDropActive;
  iVar18 = pIVar15->FrameCount;
LAB_001ece86:
  if ((((bVar25 & 1) != 0) && (pIVar15->DragDropSourceFrameCount < iVar18)) &&
     ((pIVar15->DragDropSourceFlags & 1) == 0)) {
    pIVar15->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar15->DragDropWithinSource = false;
    iVar18 = pIVar15->FrameCount;
  }
  pIVar15->WithinFrameScope = false;
  pIVar15->FrameCountEnded = iVar18;
  UpdateMouseMovingWindowEndFrame();
  uVar23 = (pIVar15->WindowsTempSortBuffer).Capacity;
  if ((int)uVar23 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar23 = 0;
    ppIVar20 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar11 = (pIVar15->WindowsTempSortBuffer).Data;
    if (ppIVar11 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar20,ppIVar11,(long)(pIVar15->WindowsTempSortBuffer).Size << 3);
      ppIVar11 = (pIVar15->WindowsTempSortBuffer).Data;
      if ((ppIVar11 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
    }
    (pIVar15->WindowsTempSortBuffer).Data = ppIVar20;
    (pIVar15->WindowsTempSortBuffer).Capacity = 0;
  }
  (pIVar15->WindowsTempSortBuffer).Size = 0;
  uVar6 = (pIVar15->Windows).Size;
  uVar28 = (ulong)uVar6;
  if ((int)uVar23 < (int)uVar6) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar20 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar28 * 8,GImAllocatorUserData);
    ppIVar11 = (pIVar15->WindowsTempSortBuffer).Data;
    if (ppIVar11 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar20,ppIVar11,(long)(pIVar15->WindowsTempSortBuffer).Size << 3);
      ppIVar11 = (pIVar15->WindowsTempSortBuffer).Data;
      if ((ppIVar11 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
    }
    (pIVar15->WindowsTempSortBuffer).Data = ppIVar20;
    (pIVar15->WindowsTempSortBuffer).Capacity = uVar6;
    uVar28 = (ulong)(uint)(pIVar15->Windows).Size;
    uVar23 = uVar6;
  }
  if ((int)uVar28 == 0) {
    iVar18 = 0;
  }
  else {
    uVar24 = 0;
    do {
      pIVar19 = (pIVar15->Windows).Data[uVar24];
      if ((pIVar19->Active != true) || ((pIVar19->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar15->WindowsTempSortBuffer,pIVar19);
        uVar28 = (ulong)(uint)(pIVar15->Windows).Size;
      }
      uVar24 = uVar24 + 1;
      iVar18 = (int)uVar28;
    } while (uVar24 != uVar28);
    uVar23 = (pIVar15->WindowsTempSortBuffer).Capacity;
  }
  iVar7 = (pIVar15->WindowsTempSortBuffer).Size;
  (pIVar15->WindowsTempSortBuffer).Size = iVar18;
  (pIVar15->Windows).Size = iVar7;
  (pIVar15->WindowsTempSortBuffer).Capacity = (pIVar15->Windows).Capacity;
  (pIVar15->Windows).Capacity = uVar23;
  ppIVar11 = (pIVar15->WindowsTempSortBuffer).Data;
  (pIVar15->WindowsTempSortBuffer).Data = (pIVar15->Windows).Data;
  (pIVar15->Windows).Data = ppIVar11;
  (pIVar15->IO).MetricsActiveWindows = pIVar15->WindowsActiveCount;
  ((pIVar15->IO).Fonts)->Locked = false;
  (pIVar15->IO).AppFocusLost = false;
  (pIVar15->IO).MouseWheel = 0.0;
  (pIVar15->IO).MouseWheelH = 0.0;
  if ((pIVar15->IO).InputQueueCharacters.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar12 = (pIVar15->IO).InputQueueCharacters.Data;
    if (puVar12 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar12,(long)(pIVar15->IO).InputQueueCharacters.Size * 2);
      puVar12 = (pIVar15->IO).InputQueueCharacters.Data;
      if ((puVar12 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar12,GImAllocatorUserData);
    }
    (pIVar15->IO).InputQueueCharacters.Data = __dest;
    (pIVar15->IO).InputQueueCharacters.Capacity = 0;
  }
  (pIVar15->IO).InputQueueCharacters.Size = 0;
  iVar18 = (pIVar15->Hooks).Size;
  if (0 < iVar18) {
    lVar26 = 0;
    lVar27 = 0;
    do {
      pIVar8 = (pIVar15->Hooks).Data;
      if (*(int *)(pIVar8 + lVar26 + 4) == 3) {
        (**(code **)(pIVar8 + lVar26 + 0x10))(pIVar15,pIVar8 + lVar26);
        iVar18 = (pIVar15->Hooks).Size;
      }
      lVar27 = lVar27 + 1;
      lVar26 = lVar26 + 0x20;
    } while (lVar27 < iVar18);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
        g.IO.SetPlatformImeDataFn(GetMainViewport(), &g.PlatformImeData);

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.AppFocusLost = false;
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}